

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_cpc.cpp
# Opt level: O2

void SaveCDT_SnapshotWithPalette(path *fname,aint startAddr,byte screenMode,byte *palette)

{
  bool bVar1;
  aint aVar2;
  aint aVar3;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var4;
  CDevicePage *pCVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *this;
  word in_R8W;
  word baseAddr;
  byte *pbVar9;
  word in_R9W;
  aint i;
  int iVar10;
  byte screenMode_00;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  byte bVar14;
  int local_154;
  allocator<char> local_141;
  byte *local_140;
  aint local_134;
  int local_130;
  uint local_12c;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> ram;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> ram_1;
  aint pages_len [4];
  uchar *pages_ram [4];
  byte loader [114];
  aint pages_start [4];
  
  bVar14 = 0;
  bVar1 = anon_unknown.dwarf_1f4b0::isCPC6128();
  if (bVar1) {
    _Var4.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__(0xc000);
    ram._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         _Var4.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    pCVar5 = CDevice::GetPage(Device,0);
    memcpy((void *)_Var4.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,pCVar5->RAM,0x4000);
    pCVar5 = CDevice::GetPage(Device,1);
    memcpy((byte *)((long)_Var4.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x4000),
           pCVar5->RAM,0x4000);
    pCVar5 = CDevice::GetPage(Device,2);
    memcpy((byte *)((long)_Var4.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x8000),
           pCVar5->RAM,0x4000);
    local_12c = 0xff;
    if (screenMode < 3) {
      local_12c = (uint)screenMode;
    }
    bVar1 = CDTUtil::hasScreen();
    aVar2 = CDTUtil::calcRAMStart
                      ((byte *)_Var4.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0xc000);
    aVar3 = CDTUtil::calcRAMLength
                      ((byte *)_Var4.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0xc000);
    if (aVar2 == 0x10000 || aVar3 == 0) {
      Error("[SAVECDT] Could not determine the start and end of the program",(char *)0x0,SUPPRESS);
    }
    else {
      local_130 = aVar3 - aVar2;
      if (startAddr < 0) {
        startAddr = aVar2;
      }
      pbVar9 = loader;
      pbVar7 = SaveCDT_AmstradCPC6128;
      pbVar8 = pbVar9;
      for (lVar6 = 0x5e; lVar6 != 0; lVar6 = lVar6 + -1) {
        *pbVar8 = *pbVar7;
        pbVar7 = pbVar7 + (ulong)bVar14 * -2 + 1;
        pbVar8 = pbVar8 + (ulong)bVar14 * -2 + 1;
      }
      loader[0x57] = (byte)startAddr;
      loader[0x58] = (byte)((uint)startAddr >> 8);
      loader[0x59] = (byte)aVar2;
      loader[0x5a] = (byte)((uint)aVar2 >> 8);
      loader[0x5b] = (byte)local_130;
      loader[0x5c] = (byte)((uint)local_130 >> 8);
      pbVar7 = loader + 0x5e;
      uVar12 = 0;
      local_154 = 0x5e;
      local_140 = palette;
      local_134 = aVar2;
      loader[0x56] = bVar1;
      for (iVar10 = 4; baseAddr = (word)pbVar9, iVar10 < Device->PagesCount; iVar10 = iVar10 + 1) {
        pCVar5 = CDevice::GetPage(Device,iVar10);
        aVar2 = CDTUtil::calcRAMStart(pCVar5->RAM,0x4000);
        pCVar5 = CDevice::GetPage(Device,iVar10);
        aVar3 = CDTUtil::calcRAMLength(pCVar5->RAM,0x4000);
        if ((aVar2 != 0x10000) && (aVar3 != 0)) {
          *pbVar7 = (byte)iVar10;
          pbVar7[1] = (byte)aVar2;
          pbVar7[2] = (byte)((uint)aVar2 >> 8);
          pbVar7[3] = (byte)aVar3;
          pbVar7[4] = (byte)((uint)aVar3 >> 8);
          pCVar5 = CDevice::GetPage(Device,iVar10);
          pbVar7 = pbVar7 + 5;
          local_154 = local_154 + 5;
          pages_ram[(int)uVar12] = pCVar5->RAM;
          pages_start[(int)uVar12] = aVar2;
          pages_len[(int)uVar12] = aVar3;
          uVar12 = uVar12 + 1;
        }
      }
      loader[0x5d] = (byte)uVar12;
      TZX_CreateEmpty(fname);
      TZX_AppendPauseBlock(fname,2000);
      CDTUtil::writeBASICLoader(fname,(byte)local_12c,local_140);
      std::__cxx11::string::string<std::allocator<char>>((string *)&ram_1,"CODE",&local_141);
      CDTUtil::writeUserProgram(fname,(string *)&ram_1,loader,local_154,baseAddr,in_R9W);
      std::__cxx11::string::~string((string *)&ram_1);
      if (bVar1) {
        pCVar5 = CDevice::GetPage(Device,3);
        pbVar9 = pCVar5->RAM;
        pCVar5 = CDevice::GetPage(Device,3);
        CDTUtil::writeChunkedData(fname,pbVar9,pCVar5->Size,1000,'\x16');
      }
      uVar11 = 0;
      uVar13 = (ulong)uVar12;
      if ((int)uVar12 < 1) {
        uVar13 = uVar11;
      }
      for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
        CDTUtil::writeChunkedData
                  (fname,pages_ram[uVar11] + pages_start[uVar11],pages_len[uVar11],1000,'\x16');
      }
      CDTUtil::writeChunkedData
                (fname,(byte *)((long)_Var4.
                                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                               (long)local_134),local_130,1000,'\x16');
    }
    this = &ram;
  }
  else {
    local_140 = palette;
    _Var4.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
         operator_new__(0xc000);
    ram_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         _Var4.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    pCVar5 = CDevice::GetPage(Device,0);
    memcpy((void *)_Var4.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,pCVar5->RAM,0x4000);
    pCVar5 = CDevice::GetPage(Device,1);
    memcpy((byte *)((long)_Var4.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x4000),
           pCVar5->RAM,0x4000);
    pCVar5 = CDevice::GetPage(Device,2);
    memcpy((byte *)((long)_Var4.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 0x8000),
           pCVar5->RAM,0x4000);
    screenMode_00 = 0xff;
    if (screenMode < 3) {
      screenMode_00 = screenMode;
    }
    bVar1 = CDTUtil::hasScreen();
    aVar2 = CDTUtil::calcRAMStart
                      ((byte *)_Var4.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0xc000);
    aVar3 = CDTUtil::calcRAMLength
                      ((byte *)_Var4.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0xc000);
    if (aVar2 == 0x10000 || aVar3 == 0) {
      Error("[SAVECDT] Could not determine the start and end of the program",(char *)0x0,SUPPRESS);
    }
    else {
      iVar10 = aVar3 - aVar2;
      if (startAddr < 0) {
        startAddr = aVar2;
      }
      loader[0x20] = 0x80;
      loader[0x21] = '>';
      loader[0x22] = '\x16';
      loader[0x23] = 0xc3;
      loader[0x24] = 0xa1;
      loader[0x10] = '@';
      loader[0x11] = '>';
      loader[0x12] = '\x16';
      loader[0x13] = 0xcd;
      loader[0x14] = 0xa1;
      loader[0x15] = 0xbc;
      loader[0x16] = '*';
      loader[0x17] = '\'';
      loader[0x18] = 0x80;
      loader[0x19] = 0xe5;
      loader[0x1a] = '*';
      loader[0x1b] = ')';
      loader[0x1c] = 0x80;
      loader[0x1d] = 0xed;
      loader[0x1e] = '[';
      loader[0x1f] = '+';
      loader[0] = '>';
      loader[1] = 0xff;
      loader[2] = 0xcd;
      loader[3] = 'k';
      loader[4] = 0xbc;
      loader[5] = ':';
      loader[6] = '&';
      loader[7] = 0x80;
      loader[8] = 0xb7;
      loader[9] = '(';
      loader[10] = '\v';
      loader[0xb] = '!';
      loader[0xc] = '\0';
      loader[0xd] = 0xc0;
      loader[0xe] = '\x11';
      loader[0xf] = '\0';
      loader[0x26] = bVar1;
      loader[0x25] = 0xbc;
      loader[0x27] = (byte)startAddr;
      loader[0x28] = (byte)((uint)startAddr >> 8);
      loader[0x29] = (byte)aVar2;
      loader[0x2a] = (byte)((uint)aVar2 >> 8);
      loader[0x2b] = (byte)iVar10;
      loader[0x2c] = (byte)((uint)iVar10 >> 8);
      TZX_CreateEmpty(fname);
      TZX_AppendPauseBlock(fname,2000);
      CDTUtil::writeBASICLoader(fname,screenMode_00,local_140);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)pages_ram,"CODE",(allocator<char> *)pages_len);
      CDTUtil::writeUserProgram(fname,(string *)pages_ram,loader,0x2d,in_R8W,in_R9W);
      std::__cxx11::string::~string((string *)pages_ram);
      if (bVar1) {
        pCVar5 = CDevice::GetPage(Device,3);
        pbVar9 = pCVar5->RAM;
        pCVar5 = CDevice::GetPage(Device,3);
        CDTUtil::writeChunkedData(fname,pbVar9,pCVar5->Size,1000,'\x16');
      }
      CDTUtil::writeChunkedData
                (fname,(byte *)((long)_Var4.
                                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                               (long)aVar2),iVar10,1000,'\x16');
    }
    this = &ram_1;
  }
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(this);
  return;
}

Assistant:

static void SaveCDT_SnapshotWithPalette(const std::filesystem::path & fname,
										aint startAddr, byte screenMode, const byte* palette)
{
	isCPC6128() ?
		createCDTDump6128(fname, startAddr, screenMode, palette) :
		createCDTDump464(fname, startAddr, screenMode, palette);
}